

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int level_00;
  size_t sStack_d0;
  lua_Debug ar;
  
  iVar1 = lua_gettop(L);
  iVar5 = 1;
  level_00 = 1;
  do {
    iVar4 = level_00;
    level_00 = iVar5;
    iVar2 = lua_getstack(L1,level_00,&ar);
    iVar5 = level_00 * 2;
  } while (iVar2 != 0);
  while (iVar5 = iVar4, iVar5 < level_00) {
    iVar2 = (level_00 + iVar5) / 2;
    iVar3 = lua_getstack(L1,iVar2,&ar);
    iVar4 = iVar2 + 1;
    if (iVar3 == 0) {
      level_00 = iVar2;
      iVar4 = iVar5;
    }
  }
  iVar5 = 0xc;
  if (level_00 < 0x18) {
    iVar5 = 0;
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n");
  }
  lua_pushlstring(L,"stack traceback:",0x10);
  do {
    while( true ) {
      iVar4 = lua_getstack(L1,level,&ar);
      if (iVar4 == 0) {
        iVar5 = lua_gettop(L);
        lua_concat(L,iVar5 - iVar1);
        return;
      }
      level = level + 1;
      if (level != iVar5) break;
      lua_pushlstring(L,"\n\t...",5);
      level = level_00 + -0xb;
    }
    lua_getinfo(L1,"Slnt",&ar);
    lua_pushfstring(L,"\n\t%s:",ar.short_src);
    if (0 < ar.currentline) {
      lua_pushfstring(L,"%d:");
    }
    lua_pushlstring(L," in ",4);
    if (*ar.namewhat == '\0') {
      if (*ar.what == 'C') {
        iVar4 = pushglobalfuncname(L,&ar);
        if (iVar4 == 0) {
          pcVar6 = "?";
          sStack_d0 = 1;
          goto LAB_001123c6;
        }
        pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
        lua_pushfstring(L,"function \'%s\'",pcVar6);
        lua_remove(L,-2);
      }
      else if (*ar.what == 'm') {
        pcVar6 = "main chunk";
        sStack_d0 = 10;
LAB_001123c6:
        lua_pushlstring(L,pcVar6,sStack_d0);
      }
      else {
        lua_pushfstring(L,"function <%s:%d>",ar.short_src,(ulong)(uint)ar.linedefined);
      }
    }
    else {
      lua_pushfstring(L,"function \'%s\'",ar.name);
    }
    if (ar.istailcall != '\0') {
      lua_pushlstring(L,"\n\t(...tail calls...)",0x14);
    }
    iVar4 = lua_gettop(L);
    lua_concat(L,iVar4 - iVar1);
  } while( true );
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int numlevels = countlevels(L1);
  int mark = (numlevels > LEVELS1 + LEVELS2) ? LEVELS1 : 0;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (level == mark) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = numlevels - LEVELS2;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}